

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_svr4c_Z.c
# Opt level: O0

void test_read_format_cpio_svr4c_Z(void)

{
  archive *paVar1;
  char *pcVar2;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  archive *a;
  archive_entry *ae;
  void *in_stack_00000020;
  archive *in_stack_ffffffffffffffe8;
  archive *paVar3;
  int n;
  wchar_t in_stack_fffffffffffffff8;
  wchar_t in_stack_fffffffffffffffc;
  
  paVar1 = archive_read_new();
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                   in_stack_fffffffffffffff8,(char *)paVar1,in_stack_ffffffffffffffe8);
  archive_read_support_filter_all(in_stack_ffffffffffffffe8);
  paVar3 = paVar1;
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar1,
                      (longlong)paVar1,(char *)0x1781b0,in_stack_00000020);
  archive_read_support_format_all(paVar1);
  paVar1 = paVar3;
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar3,
                      (longlong)paVar3,(char *)0x1781e9,in_stack_00000020);
  archive_read_open_memory(paVar1,paVar3,0x1781ff);
  paVar3 = paVar1;
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar1,
                      (longlong)paVar1,(char *)0x17822e,in_stack_00000020);
  archive_read_next_header(paVar3,(archive_entry **)paVar1);
  paVar1 = paVar3;
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar3,
                      (longlong)paVar3,(char *)0x17826c,in_stack_00000020);
  n = (int)((ulong)paVar3 >> 0x20);
  pcVar2 = archive_filter_name(paVar1,n);
  failure("archive_filter_name(a, 0)=\"%s\"",pcVar2);
  archive_filter_code(paVar1,n);
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar1,0
                      ,(char *)0x1782c7,in_stack_00000020);
  pcVar2 = archive_format_name(paVar1);
  failure("archive_format_name(a)=\"%s\"",pcVar2);
  archive_format(paVar1);
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar1,0
                      ,(char *)0x17831e,in_stack_00000020);
  archive_entry_is_encrypted
            ((archive_entry *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar1,0
                      ,(char *)0x178357,in_stack_00000020);
  archive_read_has_encrypted_entries
            ((archive *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar1,
                      (longlong)paVar1,(char *)0x178393,in_stack_00000020);
  archive_read_close((archive *)0x17839d);
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar1,
                      (longlong)paVar1,(char *)0x1783cc,in_stack_00000020);
  archive_read_free((archive *)0x1783d6);
  assertion_equal_int((char *)a,unaff_retaddr_00,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar1,0
                      ,(char *)0x178404,in_stack_00000020);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_svr4c_Z)
{
	struct archive_entry *ae;
	struct archive *a;
/*	printf("Archive address: start=%X, end=%X\n", archive, archive+sizeof(archive)); */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	failure("archive_filter_name(a, 0)=\"%s\"",
	    archive_filter_name(a, 0));
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	failure("archive_format_name(a)=\"%s\"", archive_format_name(a));
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_CPIO_SVR4_CRC);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}